

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

int ON_String::Length(char *s,size_t string_capacity)

{
  size_t sVar1;
  size_t sVar2;
  
  if (s == (char *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0x7ffffffd;
    if (string_capacity < 0x7ffffffd) {
      sVar1 = string_capacity;
    }
    for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
      if (s[sVar2] == '\0') {
        return (int)sVar2;
      }
    }
  }
  return (int)sVar1;
}

Assistant:

int ON_String::Length(
  const char* s,
  size_t string_capacity
)
{
  if (nullptr == s)
    return 0;
  if (string_capacity > 2147483645)
    string_capacity = 2147483645;
  size_t slen = 0;
  while (slen < string_capacity && 0 != *s++)
    slen++;
  return ((int)slen);
}